

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void inter_modes_info_push
               (InterModesInfo *inter_modes_info,int mode_rate,int64_t sse,int64_t rd,
               RD_STATS *rd_cost,RD_STATS *rd_cost_y,RD_STATS *rd_cost_uv,MB_MODE_INFO *mbmi)

{
  int64_t *piVar1;
  RD_STATS *pRVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined7 uVar7;
  int iVar8;
  int iVar9;
  
  iVar3 = inter_modes_info->num;
  memcpy(inter_modes_info->mbmi_arr + iVar3,mbmi,0xb0);
  inter_modes_info->mode_rate_arr[iVar3] = mode_rate;
  inter_modes_info->sse_arr[iVar3] = sse;
  inter_modes_info->est_rd_arr[iVar3] = rd;
  uVar7 = *(undefined7 *)&rd_cost->field_0x21;
  inter_modes_info->rd_cost_arr[iVar3].skip_txfm = rd_cost->skip_txfm;
  *(undefined7 *)&inter_modes_info->rd_cost_arr[iVar3].field_0x21 = uVar7;
  iVar8 = rd_cost->rate;
  iVar9 = rd_cost->zero_rate;
  iVar4 = rd_cost->dist;
  iVar5 = rd_cost->sse;
  piVar1 = &inter_modes_info->rd_cost_arr[iVar3].rdcost;
  *piVar1 = rd_cost->rdcost;
  piVar1[1] = iVar5;
  pRVar2 = inter_modes_info->rd_cost_arr + iVar3;
  pRVar2->rate = iVar8;
  pRVar2->zero_rate = iVar9;
  pRVar2->dist = iVar4;
  uVar7 = *(undefined7 *)&rd_cost_y->field_0x21;
  inter_modes_info->rd_cost_y_arr[iVar3].skip_txfm = rd_cost_y->skip_txfm;
  *(undefined7 *)&inter_modes_info->rd_cost_y_arr[iVar3].field_0x21 = uVar7;
  iVar8 = rd_cost_y->rate;
  iVar9 = rd_cost_y->zero_rate;
  iVar4 = rd_cost_y->dist;
  iVar5 = rd_cost_y->sse;
  piVar1 = &inter_modes_info->rd_cost_y_arr[iVar3].rdcost;
  *piVar1 = rd_cost_y->rdcost;
  piVar1[1] = iVar5;
  pRVar2 = inter_modes_info->rd_cost_y_arr + iVar3;
  pRVar2->rate = iVar8;
  pRVar2->zero_rate = iVar9;
  pRVar2->dist = iVar4;
  iVar8 = rd_cost_uv->zero_rate;
  iVar4 = rd_cost_uv->dist;
  iVar5 = rd_cost_uv->rdcost;
  iVar6 = rd_cost_uv->sse;
  pRVar2 = inter_modes_info->rd_cost_uv_arr + iVar3;
  pRVar2->rate = rd_cost_uv->rate;
  pRVar2->zero_rate = iVar8;
  pRVar2->dist = iVar4;
  piVar1 = &inter_modes_info->rd_cost_uv_arr[iVar3].rdcost;
  *piVar1 = iVar5;
  piVar1[1] = iVar6;
  uVar7 = *(undefined7 *)&rd_cost_uv->field_0x21;
  inter_modes_info->rd_cost_uv_arr[iVar3].skip_txfm = rd_cost_uv->skip_txfm;
  *(undefined7 *)&inter_modes_info->rd_cost_uv_arr[iVar3].field_0x21 = uVar7;
  inter_modes_info->num = inter_modes_info->num + 1;
  return;
}

Assistant:

static inline void inter_modes_info_push(InterModesInfo *inter_modes_info,
                                         int mode_rate, int64_t sse, int64_t rd,
                                         RD_STATS *rd_cost, RD_STATS *rd_cost_y,
                                         RD_STATS *rd_cost_uv,
                                         const MB_MODE_INFO *mbmi) {
  const int num = inter_modes_info->num;
  assert(num < MAX_INTER_MODES);
  inter_modes_info->mbmi_arr[num] = *mbmi;
  inter_modes_info->mode_rate_arr[num] = mode_rate;
  inter_modes_info->sse_arr[num] = sse;
  inter_modes_info->est_rd_arr[num] = rd;
  inter_modes_info->rd_cost_arr[num] = *rd_cost;
  inter_modes_info->rd_cost_y_arr[num] = *rd_cost_y;
  inter_modes_info->rd_cost_uv_arr[num] = *rd_cost_uv;
  ++inter_modes_info->num;
}